

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void websocket_optimize4broadcasts(intptr_t type,int enable)

{
  long lVar1;
  intptr_t *local_28;
  intptr_t *counter;
  _func_fio_msg_metadata_s_fio_str_info_s_fio_str_info_s_uint8_t *callback;
  int enable_local;
  intptr_t type_local;
  
  if (type == -0x20) {
    local_28 = &websocket_optimize4broadcasts::generic;
    counter = (intptr_t *)websocket_optimize_generic;
  }
  else if (type == -0x21) {
    local_28 = &websocket_optimize4broadcasts::text;
    counter = (intptr_t *)websocket_optimize_text;
  }
  else {
    if (type != -0x22) {
      return;
    }
    local_28 = &websocket_optimize4broadcasts::binary;
    counter = (intptr_t *)websocket_optimize_binary;
  }
  if (enable == 0) {
    LOCK();
    lVar1 = *local_28;
    *local_28 = *local_28 + -1;
    UNLOCK();
    if (lVar1 == 1) {
      fio_message_metadata_callback_set((fio_msg_metadata_fn)counter,0);
    }
  }
  else {
    LOCK();
    lVar1 = *local_28;
    *local_28 = *local_28 + 1;
    UNLOCK();
    if (lVar1 == 0) {
      fio_message_metadata_callback_set((fio_msg_metadata_fn)counter,1);
    }
  }
  return;
}

Assistant:

void websocket_optimize4broadcasts(intptr_t type, int enable) {
  static intptr_t generic = 0;
  static intptr_t text = 0;
  static intptr_t binary = 0;
  fio_msg_metadata_s (*callback)(fio_str_info_s, fio_str_info_s, uint8_t);
  intptr_t *counter;
  switch ((0 - type)) {
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB):
    counter = &generic;
    callback = websocket_optimize_generic;
    break;
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB_TEXT):
    counter = &text;
    callback = websocket_optimize_text;
    break;
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB_BINARY):
    counter = &binary;
    callback = websocket_optimize_binary;
    break;
  default:
    return;
  }
  if (enable) {
    if (fio_atomic_add(counter, 1) == 1) {
      fio_message_metadata_callback_set(callback, 1);
    }
  } else {
    if (fio_atomic_sub(counter, 1) == 0) {
      fio_message_metadata_callback_set(callback, 0);
    }
  }
}